

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t canLrzip(void)

{
  wchar_t wVar1;
  
  if (canLrzip::tested == L'\0') {
    canLrzip::tested = L'\x01';
    wVar1 = systemf("lrzip -V %s",redirectArgs);
    if (wVar1 == L'\0') {
      canLrzip::value = L'\x01';
    }
  }
  return canLrzip::value;
}

Assistant:

int
canLrzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lrzip -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}